

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk_algorithms.cc
# Opt level: O2

string * __thiscall
topk_algorithms::ThresholdAlgorithmInstance::ranks_str_abi_cxx11_
          (string *__return_storage_ptr__,ThresholdAlgorithmInstance *this)

{
  long lVar1;
  string *psVar2;
  pointer puVar3;
  bool bVar4;
  Rank *pRVar5;
  unsigned_long *r;
  long lVar6;
  undefined1 auVar7 [8];
  int i;
  ulong uVar8;
  pointer puVar9;
  unsigned_long local_1d8;
  stringstream ss;
  ostream local_1c8 [376];
  string *local_50;
  undefined1 auStack_48 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> ranks;
  
  ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_48 = (undefined1  [8])0x0;
  ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_50 = __return_storage_ptr__;
  for (uVar8 = 0;
      puVar3 = ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, auVar7 = auStack_48,
      uVar8 < (ulong)((long)(this->_rms_list)._ranks.
                            super__Vector_base<std::unique_ptr<rank::Rank,_std::default_delete<rank::Rank>_>,_std::allocator<std::unique_ptr<rank::Rank,_std::default_delete<rank::Rank>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_rms_list)._ranks.
                            super__Vector_base<std::unique_ptr<rank::Rank,_std::default_delete<rank::Rank>_>,_std::allocator<std::unique_ptr<rank::Rank,_std::default_delete<rank::Rank>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    pRVar5 = rank::RankList::rank(&this->_rms_list,uVar8);
    local_1d8 = ((long)(pRVar5->_entries).
                       super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(pRVar5->_entries).
                      super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x18;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_48,&local_1d8);
  }
  if (auStack_48 !=
      (undefined1  [8])
      ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar6 = (long)ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start - (long)auStack_48;
    uVar8 = lVar6 >> 3;
    lVar1 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<topk_algorithms::ThresholdAlgorithmInstance::ranks_str[abi:cxx11]()const::__0>>
              (auStack_48,
               ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar6 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<topk_algorithms::ThresholdAlgorithmInstance::ranks_str[abi:cxx11]()const::__0>>
                (auVar7,puVar3);
    }
    else {
      puVar9 = (pointer)((long)auVar7 + 0x80);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<topk_algorithms::ThresholdAlgorithmInstance::ranks_str[abi:cxx11]()const::__0>>
                (auVar7,puVar9);
      for (; puVar9 != puVar3; puVar9 = puVar9 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Val_comp_iter<topk_algorithms::ThresholdAlgorithmInstance::ranks_str[abi:cxx11]()const::__0>>
                  (puVar9);
      }
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d8);
  puVar3 = ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar4 = true;
  for (auVar7 = auStack_48; psVar2 = local_50, auVar7 != (undefined1  [8])puVar3;
      auVar7 = (undefined1  [8])((long)auVar7 + 8)) {
    if (!bVar4) {
      std::operator<<(local_1c8,",");
    }
    std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
    bVar4 = false;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1d8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_48);
  return psVar2;
}

Assistant:

std::string ThresholdAlgorithmInstance::ranks_str() const {
        std::vector<Count> ranks;
        for (auto i=0;i<_rms_list.size();++i) { ranks.push_back(_rms_list.rank(i)->size()); }
        std::sort(ranks.begin(), ranks.end(), [](Count a, Count b) { return a > b; });
        std::stringstream ss;
        bool first = true;
        for (auto &r: ranks) {
            if (!first)
                ss << ",";
            ss << r;
            first = false;
        }
        return ss.str();
    }